

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVarLengthArray<std::array<QImage,_16UL>,_6LL>::~QVarLengthArray
          (QVarLengthArray<std::array<QImage,_16UL>,_6LL> *this)

{
  undefined1 *puVar1;
  
  std::_Destroy_n_aux<false>::__destroy_n<std::array<QImage,16ul>*,long_long>
            ((array<QImage,_16UL> *)
             (this->super_QVLABase<std::array<QImage,_16UL>_>).super_QVLABaseBase.ptr,
             (this->super_QVLABase<std::array<QImage,_16UL>_>).super_QVLABaseBase.s);
  puVar1 = (undefined1 *)(this->super_QVLABase<std::array<QImage,_16UL>_>).super_QVLABaseBase.ptr;
  if ((QVLAStorage<384UL,_8UL,_6LL> *)puVar1 != &this->super_QVLAStorage<384UL,_8UL,_6LL>) {
    QtPrivate::sizedFree
              (puVar1,(this->super_QVLABase<std::array<QImage,_16UL>_>).super_QVLABaseBase.a * 0x180
              );
    return;
  }
  return;
}

Assistant:

inline ~QVarLengthArray()
    {
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(data(), size());
        if (data() != reinterpret_cast<T *>(this->array))
            QtPrivate::sizedFree(data(), capacity(), sizeof(T));
    }